

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

WhereTerm * findTerm(WhereClause *pWC,int iCur,int iColumn,Bitmask notReady,u32 op,Index *pIdx)

{
  Parse *pParse_00;
  int iVar1;
  Expr *pEVar2;
  CollSeq *pCStack_e0;
  char idxaff;
  CollSeq *pColl;
  int aEquiv [22];
  int local_74;
  int local_70;
  int iEquiv;
  int nEquiv;
  int iOrigCol;
  Parse *pParse;
  Expr *pX;
  int k;
  int j;
  WhereClause *pWCOrig;
  WhereTerm *pResult;
  WhereTerm *pTerm;
  Index *pIdx_local;
  u32 op_local;
  Bitmask notReady_local;
  int iColumn_local;
  int iCur_local;
  WhereClause *pWC_local;
  
  pWCOrig = (WhereClause *)0x0;
  local_70 = 2;
  local_74 = 2;
  _iColumn_local = pWC;
  notReady_local._4_4_ = iCur;
  notReady_local._0_4_ = iColumn;
  do {
    while (_iColumn_local == (WhereClause *)0x0) {
      if (local_70 <= local_74) {
        return (WhereTerm *)pWCOrig;
      }
      iVar1 = local_74 + 1;
      notReady_local._4_4_ = aEquiv[(long)local_74 + -2];
      local_74 = local_74 + 2;
      notReady_local._0_4_ = aEquiv[(long)iVar1 + -2];
      _iColumn_local = pWC;
    }
    pResult = _iColumn_local->a;
    for (pX._0_4_ = _iColumn_local->nTerm; (int)pX != 0; pX._0_4_ = (int)pX + -1) {
      if ((pResult->leftCursor != notReady_local._4_4_) ||
         ((pResult->u).leftColumn != (int)notReady_local)) goto LAB_001dcdbb;
      if (((pResult->prereqRight & notReady) == 0) && ((pResult->eOperator & op & 0xfff) != 0)) {
        if (((iColumn < 0) || (pIdx == (Index *)0x0)) || ((pResult->eOperator & 0x80) != 0)) {
LAB_001dccbf:
          if ((pResult->prereqRight == 0) && ((pResult->eOperator & 2) != 0)) {
            return pResult;
          }
          if (pWCOrig == (WhereClause *)0x0) {
            pWCOrig = (WhereClause *)pResult;
          }
          goto LAB_001dccfa;
        }
        pEVar2 = pResult->pExpr;
        pParse_00 = _iColumn_local->pParse;
        iVar1 = sqlite3IndexAffinityOk(pEVar2,pIdx->pTable->aCol[iColumn].affinity);
        if (iVar1 != 0) {
          pCStack_e0 = sqlite3BinaryCompareCollSeq(pParse_00,pEVar2->pLeft,pEVar2->pRight);
          if (pCStack_e0 == (CollSeq *)0x0) {
            pCStack_e0 = pParse_00->db->pDfltColl;
          }
          for (pX._4_4_ = 0; pIdx->aiColumn[pX._4_4_] != iColumn; pX._4_4_ = pX._4_4_ + 1) {
            if ((int)(uint)pIdx->nColumn <= pX._4_4_) {
              return (WhereTerm *)0x0;
            }
          }
          iVar1 = sqlite3_stricmp(pCStack_e0->zName,pIdx->azColl[pX._4_4_]);
          if (iVar1 == 0) goto LAB_001dccbf;
        }
      }
      else {
LAB_001dccfa:
        if (((pResult->eOperator & 0x400) != 0) && (local_70 < 0x16)) {
          pEVar2 = sqlite3ExprSkipCollate(pResult->pExpr->pRight);
          pX._4_4_ = 0;
          while ((pX._4_4_ < local_70 &&
                 ((aEquiv[(long)pX._4_4_ + -2] != pEVar2->iTable ||
                  (aEquiv[(long)(pX._4_4_ + 1) + -2] != (int)pEVar2->iColumn))))) {
            pX._4_4_ = pX._4_4_ + 2;
          }
          if (pX._4_4_ == local_70) {
            aEquiv[(long)pX._4_4_ + -2] = pEVar2->iTable;
            aEquiv[(long)(pX._4_4_ + 1) + -2] = (int)pEVar2->iColumn;
            local_70 = local_70 + 2;
          }
        }
      }
LAB_001dcdbb:
      pResult = pResult + 1;
    }
    _iColumn_local = _iColumn_local->pOuter;
  } while( true );
}

Assistant:

static WhereTerm *findTerm(
  WhereClause *pWC,     /* The WHERE clause to be searched */
  int iCur,             /* Cursor number of LHS */
  int iColumn,          /* Column number of LHS */
  Bitmask notReady,     /* RHS must not overlap with this mask */
  u32 op,               /* Mask of WO_xx values describing operator */
  Index *pIdx           /* Must be compatible with this index, if not NULL */
){
  WhereTerm *pTerm;            /* Term being examined as possible result */
  WhereTerm *pResult = 0;      /* The answer to return */
  WhereClause *pWCOrig = pWC;  /* Original pWC value */
  int j, k;                    /* Loop counters */
  Expr *pX;                /* Pointer to an expression */
  Parse *pParse;           /* Parsing context */
  int iOrigCol = iColumn;  /* Original value of iColumn */
  int nEquiv = 2;          /* Number of entires in aEquiv[] */
  int iEquiv = 2;          /* Number of entries of aEquiv[] processed so far */
  int aEquiv[22];          /* iCur,iColumn and up to 10 other equivalents */

  assert( iCur>=0 );
  aEquiv[0] = iCur;
  aEquiv[1] = iColumn;
  for(;;){
    for(pWC=pWCOrig; pWC; pWC=pWC->pOuter){
      for(pTerm=pWC->a, k=pWC->nTerm; k; k--, pTerm++){
        if( pTerm->leftCursor==iCur
          && pTerm->u.leftColumn==iColumn
        ){
          if( (pTerm->prereqRight & notReady)==0
           && (pTerm->eOperator & op & WO_ALL)!=0
          ){
            if( iOrigCol>=0 && pIdx && (pTerm->eOperator & WO_ISNULL)==0 ){
              CollSeq *pColl;
              char idxaff;
      
              pX = pTerm->pExpr;
              pParse = pWC->pParse;
              idxaff = pIdx->pTable->aCol[iOrigCol].affinity;
              if( !sqlite3IndexAffinityOk(pX, idxaff) ){
                continue;
              }
      
              /* Figure out the collation sequence required from an index for
              ** it to be useful for optimising expression pX. Store this
              ** value in variable pColl.
              */
              assert(pX->pLeft);
              pColl = sqlite3BinaryCompareCollSeq(pParse,pX->pLeft,pX->pRight);
              if( pColl==0 ) pColl = pParse->db->pDfltColl;
      
              for(j=0; pIdx->aiColumn[j]!=iOrigCol; j++){
                if( NEVER(j>=pIdx->nColumn) ) return 0;
              }
              if( sqlite3StrICmp(pColl->zName, pIdx->azColl[j]) ){
                continue;
              }
            }
            if( pTerm->prereqRight==0 && (pTerm->eOperator&WO_EQ)!=0 ){
              pResult = pTerm;
              goto findTerm_success;
            }else if( pResult==0 ){
              pResult = pTerm;
            }
          }
          if( (pTerm->eOperator & WO_EQUIV)!=0
           && nEquiv<ArraySize(aEquiv)
          ){
            pX = sqlite3ExprSkipCollate(pTerm->pExpr->pRight);
            assert( pX->op==TK_COLUMN );
            for(j=0; j<nEquiv; j+=2){
              if( aEquiv[j]==pX->iTable && aEquiv[j+1]==pX->iColumn ) break;
            }
            if( j==nEquiv ){
              aEquiv[j] = pX->iTable;
              aEquiv[j+1] = pX->iColumn;
              nEquiv += 2;
            }
          }
        }
      }
    }
    if( iEquiv>=nEquiv ) break;
    iCur = aEquiv[iEquiv++];
    iColumn = aEquiv[iEquiv++];
  }
findTerm_success:
  return pResult;
}